

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

uint8_t * apx_allocator_alloc(apx_allocator_t *self,size_t size)

{
  uint8_t *puVar1;
  
  if (size == 0 || self == (apx_allocator_t *)0x0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    if (0x20 < size) {
      puVar1 = (uint8_t *)malloc(size);
      return puVar1;
    }
    pthread_spin_lock(&self->lock);
    puVar1 = (uint8_t *)soa_alloc(&self->soa,size);
    pthread_spin_unlock(&self->lock);
  }
  return puVar1;
}

Assistant:

uint8_t *apx_allocator_alloc(apx_allocator_t *self, size_t size)
{
   uint8_t *data = 0;
   if ( (self != 0) && (size > 0) )
   {
      if (size <= SOA_SMALL_OBJECT_MAX_SIZE)
      {
         //use the small object allocator
         SPINLOCK_ENTER(self->lock);
         data = (uint8_t*) soa_alloc(&self->soa, size);
         SPINLOCK_LEAVE(self->lock);
      }
      else
      {
         //use the default allocator
         data = (uint8_t*) malloc(size);
      }
   }
   return data;
}